

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int feed_messages(ptls_t *tls,ptls_buffer_t *outbuf,size_t *out_epoch_offsets,uint8_t *input,
                 size_t *in_epoch_offsets,ptls_handshake_properties_t *props)

{
  size_t len;
  size_t sStack_40;
  int ret;
  size_t i;
  ptls_handshake_properties_t *props_local;
  size_t *in_epoch_offsets_local;
  uint8_t *input_local;
  size_t *out_epoch_offsets_local;
  ptls_buffer_t *outbuf_local;
  ptls_t *tls_local;
  
  len._4_4_ = 0x202;
  outbuf->off = 0;
  memset(out_epoch_offsets,0,0x28);
  sStack_40 = 0;
  while ((sStack_40 != 4 &&
         (((in_epoch_offsets[sStack_40 + 1] - in_epoch_offsets[sStack_40] == 0 ||
           (len._4_4_ = ptls_handle_message(tls,outbuf,out_epoch_offsets,sStack_40,
                                            input + in_epoch_offsets[sStack_40],
                                            in_epoch_offsets[sStack_40 + 1] -
                                            in_epoch_offsets[sStack_40],props), len._4_4_ == 0)) ||
          (len._4_4_ == 0x202))))) {
    sStack_40 = sStack_40 + 1;
  }
  return len._4_4_;
}

Assistant:

static int feed_messages(ptls_t *tls, ptls_buffer_t *outbuf, size_t *out_epoch_offsets, const uint8_t *input,
                         const size_t *in_epoch_offsets, ptls_handshake_properties_t *props)
{
    size_t i;
    int ret = PTLS_ERROR_IN_PROGRESS;

    outbuf->off = 0;
    memset(out_epoch_offsets, 0, sizeof(*out_epoch_offsets) * 5);

    for (i = 0; i != 4; ++i) {
        size_t len = in_epoch_offsets[i + 1] - in_epoch_offsets[i];
        if (len != 0) {
            ret = ptls_handle_message(tls, outbuf, out_epoch_offsets, i, input + in_epoch_offsets[i], len, props);
            if (!(ret == 0 || ret == PTLS_ERROR_IN_PROGRESS))
                break;
        }
    }

    return ret;
}